

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O0

vector<__int128,_std::allocator<__int128>_> * __thiscall
reed_solomn::poly_scalar_div
          (reed_solomn *this,vector<__int128,_std::allocator<__int128>_> *A,ll128 scalar)

{
  undefined1 b [16];
  undefined1 a [16];
  undefined1 a_00 [16];
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reed_solomn *in_RCX;
  vector<__int128,_std::allocator<__int128>_> *in_RDX;
  undefined8 extraout_RDX;
  reed_solomn *in_RSI;
  vector<__int128,_std::allocator<__int128>_> *in_RDI;
  int i;
  vector<__int128,_std::allocator<__int128>_> res;
  value_type *__x;
  vector<__int128,_std::allocator<__int128>_> *this_00;
  vector<__int128,_std::allocator<__int128>_> *in_stack_fffffffffffffef0;
  vector<__int128,_std::allocator<__int128>_> *A_00;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffff28;
  vector<__int128,_std::allocator<__int128>_> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 local_54;
  
  A_00 = in_RDI;
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)0x13b5cb);
  local_54 = 0;
  while( true ) {
    uVar1 = (ulong)local_54;
    sVar2 = std::vector<__int128,_std::allocator<__int128>_>::size(in_RDX);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<__int128,_std::allocator<__int128>_>::operator[](in_RDX,(long)local_54);
    __x = *(value_type **)pvVar3;
    this_00 = *(vector<__int128,_std::allocator<__int128>_> **)((long)pvVar3 + 8);
    a_00._8_8_ = in_stack_ffffffffffffff78;
    a_00._0_8_ = in_stack_ffffffffffffff70;
    in_stack_fffffffffffffef0 =
         (vector<__int128,_std::allocator<__int128>_> *)base_inverse(in_RCX,(ll128)a_00);
    a._8_8_ = in_RDI;
    a._0_8_ = in_RDX;
    b._8_8_ = uVar1;
    b._0_8_ = in_stack_fffffffffffffef0;
    in_stack_ffffffffffffff70 = extraout_RDX;
    base_mul(in_RSI,(ll128)a,(ll128)b);
    std::vector<__int128,_std::allocator<__int128>_>::push_back(this_00,__x);
    local_54 = local_54 + 1;
  }
  std::vector<__int128,_std::allocator<__int128>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  poly_strip(in_RSI,A_00);
  std::vector<__int128,_std::allocator<__int128>_>::~vector(in_stack_fffffffffffffef0);
  std::vector<__int128,_std::allocator<__int128>_>::~vector(in_stack_fffffffffffffef0);
  return A_00;
}

Assistant:

vector<ll128> reed_solomn::poly_scalar_div(vector<ll128> A, ll128 scalar) {
    vector<ll128> res;
    for (int i = 0; i < A.size(); ++i) {
        res.push_back(base_mul(A[i], base_inverse(scalar)));
    }
    return poly_strip(res);
}